

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O2

err_t bakeBPACEStep3(octet *out,octet *in,void *state)

{
  long lVar1;
  size_t n;
  ulong count;
  bool_t bVar2;
  word *b;
  err_t eVar3;
  word *state_00;
  ulong count_00;
  
  bVar2 = objIsOperable(state);
  eVar3 = 0x6d;
  if (bVar2 != 0) {
    lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
    n = *(size_t *)(lVar1 + 0x30);
    count = *(ulong *)(lVar1 + 0x38);
    count_00 = count >> 1;
    bVar2 = memIsValid(in,count_00);
    if (bVar2 != 0) {
      bVar2 = memIsValid(out,count * 5 >> 1);
      if (bVar2 != 0) {
        b = (word *)(*state + (long)state);
        state_00 = b + n * 2;
        memCopy((void *)(*(long *)((long)state + 0x20) + count_00),in,count_00);
        beltECBStart(state_00,(octet *)((long)state + 0xb0),0x20);
        beltECBStepD((void *)(*(long *)((long)state + 0x20) + count_00),count_00,state_00);
        (**(code **)((long)state + 0x60))(out,count_00,*(undefined8 *)((long)state + 0x68));
        memCopy(*(void **)((long)state + 0x20),out,count_00);
        beltECBStart(state_00,(octet *)((long)state + 0xb0),0x20);
        beltECBStepE(out,count_00,state_00);
        bakeSWU2(*(word **)((long)state + 0x28),*(ec_o **)((long)state + 0x18),
                 *(octet **)((long)state + 0x20),state_00);
        bVar2 = zzRandNZMod(*(word **)((long)state + 0x30),
                            *(word **)(*(long *)((long)state + 0x18) + 0x38),n,
                            *(gen_i *)((long)state + 0x60),*(void **)((long)state + 0x68));
        if (bVar2 == 0) {
          eVar3 = 0x130;
        }
        else {
          bVar2 = ecMulA(b,*(word **)((long)state + 0x28),*(ec_o **)((long)state + 0x18),
                         *(word **)((long)state + 0x30),n,state_00);
          if (bVar2 == 0) {
            eVar3 = 0x1f6;
          }
          else {
            lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
            (**(code **)(lVar1 + 0x48))(out + count_00,b,lVar1,state_00);
            lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
            (**(code **)(lVar1 + 0x48))(out + (count * 3 >> 1),b + n,lVar1,state_00);
            memCopy(*(void **)((long)state + 0x20),out + count_00,count);
            eVar3 = 0;
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t bakeBPACEStep3(octet out[], const octet in[], void* state)
{
	bake_bpace_o* s = (bake_bpace_o*)state;
	size_t n, no;
	// стек
	word* Va;			/* [2 * n] */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, no / 2) ||
		!memIsValid(out, 5 * no / 2))
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, 5 * no / 2, s, objKeep(s)));
	// раскладка стека
	Va = objEnd(s, word);
	stack = Va + 2 * n;
	// Rb <- beltECBDecr(Yb, K2)
	memCopy(s->R + no / 2, in, no / 2);
	beltECBStart(stack, s->K2, 32);
	beltECBStepD(s->R + no / 2, no / 2, stack);
	// Ra <-R {0, 1}^l
	s->settings->rng(out, no / 2, s->settings->rng_state);
	memCopy(s->R, out, no / 2);
	// out ||... <- beltECBEncr(Ra, K2)
	beltECBStart(stack, s->K2, 32);
	beltECBStepE(out, no / 2, stack);
	// W <- bakeSWU(Ra || Rb)
	bakeSWU2(s->W, s->ec, s->R, stack);
	// ua <-R {1, 2, ..., q - 1}
	if (!zzRandNZMod(s->u, s->ec->order, n, s->settings->rng,
		s->settings->rng_state))
		return ERR_BAD_RNG;
	// Va <- ua W
	if (!ecMulA(Va, s->W, s->ec, s->u, n, stack))
		return ERR_BAD_PARAMS;
	// ...|| out <- <Va>
	qrTo(out + no / 2, ecX(Va), s->ec->f, stack);
	qrTo(out + 3 * no / 2, ecY(Va, n), s->ec->f, stack);
	// сохранить x-координату Va
	memCopy(s->R, out + no / 2, no);
	// все нормально
	return ERR_OK;
}